

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall
FFont::FFont(FFont *this,char *name,char *nametemplate,int first,int count,int start,int fdlump,
            int spacewidth)

{
  byte bVar1;
  int iVar2;
  FTextureID FVar3;
  FTextureID FVar4;
  int iVar5;
  int iVar6;
  CharData *pCVar7;
  void *pvVar8;
  BYTE *pBVar9;
  char *pcVar10;
  FTexture *pFVar11;
  FFontChar1 *this_00;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  FTexture *sourcelump;
  bool bVar15;
  char buffer [12];
  
  this->_vptr_FFont = (_func_int **)&PTR__FFont_006f91f8;
  (this->Ranges).Array = (FRemapTable *)0x0;
  (this->Ranges).Most = 0;
  (this->Ranges).Count = 0;
  if (((undefined1)gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
    bVar15 = false;
  }
  else {
    iVar2 = strncmp(nametemplate,"STCFN",5);
    bVar15 = iVar2 == 0;
  }
  this->Lump = fdlump;
  uVar13 = (long)count << 4;
  if (count < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  pCVar7 = (CharData *)operator_new__(uVar13);
  this->Chars = pCVar7;
  uVar13 = (long)count * 8;
  if (count < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar13);
  pBVar9 = (BYTE *)operator_new__(0x100);
  this->PatchRemap = pBVar9;
  this->FirstChar = first;
  this->LastChar = count + first + -1;
  this->FontHeight = 0;
  this->GlobalKerning = 0;
  pcVar10 = copystring(name);
  this->Name = pcVar10;
  this->Next = FirstFont;
  FirstFont = this;
  this->Cursor = '_';
  uVar12 = 0x7c - start;
  bVar1 = 0;
  uVar13 = 0;
  if (0 < count) {
    uVar13 = (ulong)(uint)count;
  }
  lVar14 = 0;
  do {
    if (uVar13 << 3 == lVar14) {
      if (spacewidth == -1) {
        uVar12 = 0x4e - first;
        spacewidth = 4;
        if ((int)uVar12 < count && first < 0x4f) {
          if (this->Chars[uVar12].Pic != (FTexture *)0x0) {
            spacewidth = (this->Chars[uVar12].XMove + 1) / 2;
          }
        }
      }
      this->SpaceWidth = spacewidth;
      FixXMoves(this);
      (*this->_vptr_FFont[4])(this);
      operator_delete__(pvVar8);
      return;
    }
    *(undefined8 *)((long)pvVar8 + lVar14) = 0;
    mysnprintf(buffer,0xc,nametemplate);
    FVar3 = FTextureManager::CheckForTexture(&TexMan,buffer,8,1);
    if ((bVar15) && (start == 0x79 && 0 < FVar3.texnum)) {
      FVar4 = FTextureManager::CheckForTexture(&TexMan,"STCFN120",8,1);
      if (0 < FVar4.texnum) {
        FVar4 = FTextureManager::CheckForTexture(&TexMan,"STCFN122",8,1);
        if (0 < FVar4.texnum) goto LAB_00487b95;
      }
      bVar1 = 1;
      if (count <= (int)uVar12) goto LAB_00487c50;
      if ((uint)FVar3.texnum < TexMan.Textures.Count) {
        pFVar11 = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
      }
      else {
        pFVar11 = (FTexture *)0x0;
      }
      *(FTexture **)((long)pvVar8 + (long)(int)uVar12 * 8) = pFVar11;
      sourcelump = *(FTexture **)((long)pvVar8 + lVar14);
      bVar1 = 1;
LAB_00487c1f:
      if (sourcelump == (FTexture *)0x0) goto LAB_00487c50;
      this_00 = (FFontChar1 *)operator_new(0x70);
      FFontChar1::FFontChar1(this_00,sourcelump);
      *(FFontChar1 **)((long)&this->Chars->Pic + lVar14 * 2) = this_00;
      iVar2 = FTexture::GetScaledWidth((FTexture *)this_00);
      pCVar7 = this->Chars;
    }
    else {
      if (0 < FVar3.texnum) {
LAB_00487b95:
        if (((uint)FVar3.texnum < TexMan.Textures.Count) &&
           (pFVar11 = TexMan.Textures.Array[(uint)FVar3.texnum].Texture, pFVar11 != (FTexture *)0x0)
           ) {
          if ((bool)(bVar1 & (ulong)uVar12 * 8 == lVar14)) {
            sourcelump = (FTexture *)0x0;
          }
          else {
            *(FTexture **)((long)pvVar8 + lVar14) = pFVar11;
            sourcelump = pFVar11;
          }
          iVar5 = FTexture::GetScaledHeight(pFVar11);
          iVar6 = FTexture::GetScaledTopOffset(pFVar11);
          iVar2 = -iVar6;
          if (0 < iVar6) {
            iVar2 = iVar6;
          }
          if (this->FontHeight < iVar2 + iVar5) {
            this->FontHeight = iVar2 + iVar5;
          }
          goto LAB_00487c1f;
        }
      }
LAB_00487c50:
      pCVar7 = this->Chars;
      *(undefined8 *)((long)&pCVar7->Pic + lVar14 * 2) = 0;
      iVar2 = -0x80000000;
    }
    *(int *)((long)&pCVar7->XMove + lVar14 * 2) = iVar2;
    lVar14 = lVar14 + 8;
    start = start + 1;
  } while( true );
}

Assistant:

FFont::FFont (const char *name, const char *nametemplate, int first, int count, int start, int fdlump, int spacewidth)
{
	int i;
	FTextureID lump;
	char buffer[12];
	FTexture **charlumps;
	int maxyoffs;
	bool doomtemplate = gameinfo.gametype & GAME_DoomChex ? strncmp (nametemplate, "STCFN", 5) == 0 : false;
	bool stcfn121 = false;

	Lump = fdlump;
	Chars = new CharData[count];
	charlumps = new FTexture *[count];
	PatchRemap = new BYTE[256];
	FirstChar = first;
	LastChar = first + count - 1;
	FontHeight = 0;
	GlobalKerning = false;
	Name = copystring (name);
	Next = FirstFont;
	FirstFont = this;
	Cursor = '_';

	maxyoffs = 0;

	for (i = 0; i < count; i++)
	{
		charlumps[i] = NULL;
		mysnprintf (buffer, countof(buffer), nametemplate, i + start);

		lump = TexMan.CheckForTexture(buffer, FTexture::TEX_MiscPatch);
		if (doomtemplate && lump.isValid() && i + start == 121)
		{ // HACKHACK: Don't load STCFN121 in doom(2), because
		  // it's not really a lower-case 'y' but a '|'.
		  // Because a lot of wads with their own font seem to foolishly
		  // copy STCFN121 and make it a '|' themselves, wads must
		  // provide STCFN120 (x) and STCFN122 (z) for STCFN121 to load as a 'y'.
			if (!TexMan.CheckForTexture("STCFN120", FTexture::TEX_MiscPatch).isValid() ||
				!TexMan.CheckForTexture("STCFN122", FTexture::TEX_MiscPatch).isValid())
			{
				// insert the incorrectly named '|' graphic in its correct position.
				if (count > 124-start) charlumps[124-start] = TexMan[lump];
				lump.SetInvalid();
				stcfn121 = true;
			}
		}

		if (lump.isValid())
		{
			FTexture *pic = TexMan[lump];
			if (pic != NULL)
			{
				// set the lump here only if it represents a valid texture
				if (i != 124-start || !stcfn121)
					charlumps[i] = pic;

				int height = pic->GetScaledHeight();
				int yoffs = pic->GetScaledTopOffset();

				if (yoffs > maxyoffs)
				{
					maxyoffs = yoffs;
				}
				height += abs (yoffs);
				if (height > FontHeight)
				{
					FontHeight = height;
				}
			}
		}

		if (charlumps[i] != NULL)
		{
			Chars[i].Pic = new FFontChar1 (charlumps[i]);
			Chars[i].XMove = Chars[i].Pic->GetScaledWidth();
		}
		else
		{
			Chars[i].Pic = NULL;
			Chars[i].XMove = INT_MIN;
		}
	}

	if (spacewidth != -1)
	{
		SpaceWidth = spacewidth;
	}
	else if ('N'-first >= 0 && 'N'-first < count && Chars['N' - first].Pic != NULL)
	{
		SpaceWidth = (Chars['N' - first].XMove + 1) / 2;
	}
	else
	{
		SpaceWidth = 4;
	}

	FixXMoves();

	LoadTranslations();

	delete[] charlumps;
}